

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O3

int __thiscall Cleaner::CleanTargets(Cleaner *this,int target_count,char **targets)

{
  Verbosity VVar1;
  StringPiece path;
  bool bVar2;
  Node *target;
  ulong uVar3;
  string err;
  string target_name;
  uint64_t slash_bits;
  string local_80;
  string local_60;
  char **local_40;
  uint64_t local_38;
  
  this->status_ = 0;
  this->cleaned_files_count_ = 0;
  local_40 = targets;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->removed_)._M_t);
  std::_Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>
  ::clear(&(this->cleaned_)._M_t);
  PrintHeader(this);
  LoadDyndeps(this);
  if (0 < target_count) {
    uVar3 = 0;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,local_40[uVar3],(allocator<char> *)&local_80);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      local_80._M_string_length = 0;
      local_80.field_2._M_local_buf[0] = '\0';
      bVar2 = CanonicalizePath(&local_60,&local_38,&local_80);
      if (bVar2) {
        path.len_ = local_60._M_string_length;
        path.str_ = local_60._M_dataplus._M_p;
        target = State::LookupNode(this->state_,path);
        if (target == (Node *)0x0) {
          Error("unknown target \'%s\'",local_60._M_dataplus._M_p);
          goto LAB_0017f5e9;
        }
        VVar1 = this->config_->verbosity;
        if ((VVar1 != QUIET) && ((VVar1 == VERBOSE || (this->config_->dry_run == true)))) {
          printf("Target %s\n",local_60._M_dataplus._M_p);
        }
        DoCleanTarget(this,target);
      }
      else {
        Error("failed to canonicalize \'%s\': %s",local_60._M_dataplus._M_p,
              local_80._M_dataplus._M_p);
LAB_0017f5e9:
        this->status_ = 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,
                        CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                 local_80.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      uVar3 = uVar3 + 1;
    } while ((uint)target_count != uVar3);
  }
  if (this->config_->verbosity != QUIET) {
    printf("%d files.\n",(ulong)(uint)this->cleaned_files_count_);
  }
  return this->status_;
}

Assistant:

int Cleaner::CleanTargets(int target_count, char* targets[]) {
  Reset();
  PrintHeader();
  LoadDyndeps();
  for (int i = 0; i < target_count; ++i) {
    string target_name = targets[i];
    uint64_t slash_bits;
    string err;
    if (!CanonicalizePath(&target_name, &slash_bits, &err)) {
      Error("failed to canonicalize '%s': %s", target_name.c_str(), err.c_str());
      status_ = 1;
    } else {
      Node* target = state_->LookupNode(target_name);
      if (target) {
        if (IsVerbose())
          printf("Target %s\n", target_name.c_str());
        DoCleanTarget(target);
      } else {
        Error("unknown target '%s'", target_name.c_str());
        status_ = 1;
      }
    }
  }
  PrintFooter();
  return status_;
}